

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

Vector3d * Object::getIntersection(Vector2d *vec,Vector3d *_p1,Vector3d *_p2,Vector2d *obs)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  int __x;
  Vector3d *in_RDI;
  double extraout_XMM0_Qa;
  double angle;
  Vector2d new_vec;
  Vector2d pt;
  double det;
  Vector2d b;
  double b2;
  double b1;
  Matrix2d A;
  Vector2d vec_line;
  Vector2d p2;
  Vector2d p1;
  Vector3d *result;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *in_stack_fffffffffffffce8;
  MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_> *in_stack_fffffffffffffcf0;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *this;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffffcf8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_fffffffffffffd00;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffffd10;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffffd18;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_02;
  dense_product_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_6>
  *in_stack_fffffffffffffd20;
  Scalar SVar4;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> local_230 [24];
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_218 [24];
  XprTypeNested local_200;
  Product<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_1f8;
  double local_1d0;
  double local_1b0;
  Product<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> local_198;
  Scalar local_188;
  double local_180;
  Product<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> local_160;
  Scalar local_150;
  double local_148;
  double local_130;
  undefined1 local_f8 [248];
  
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffcf0,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_> *)
             in_stack_fffffffffffffce8);
  Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,2,1,false>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffcf0,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_> *)
             in_stack_fffffffffffffce8);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
  Eigen::Matrix<double,2,2,0,2,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            ((Matrix<double,_2,_2,_0,_2,_2> *)in_stack_fffffffffffffcf0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
              *)in_stack_fffffffffffffce8);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  local_130 = -*pdVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator<<
            (in_stack_fffffffffffffcf8,(Scalar *)in_stack_fffffffffffffcf0);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)in_stack_fffffffffffffcf0,
             (Index)in_stack_fffffffffffffce8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (in_stack_fffffffffffffd00,(Scalar *)in_stack_fffffffffffffcf8);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  local_148 = -*pdVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (in_stack_fffffffffffffd00,(Scalar *)in_stack_fffffffffffffcf8);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)in_stack_fffffffffffffcf0,
             (Index)in_stack_fffffffffffffce8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (in_stack_fffffffffffffd00,(Scalar *)in_stack_fffffffffffffcf8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)0x14a657);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  local_180 = -*pdVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)in_stack_fffffffffffffcf0,
             (Index)in_stack_fffffffffffffce8);
  Eigen::Matrix<double,1,2,1,1,2>::Matrix<double,double>
            ((Matrix<double,_1,_2,_1,_1,_2> *)in_stack_fffffffffffffd00,
             (double *)in_stack_fffffffffffffcf8,(double *)in_stack_fffffffffffffcf0);
  local_160 = Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                         in_stack_fffffffffffffcf0,
                         (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                         in_stack_fffffffffffffce8);
  local_150 = Eigen::internal::dense_product_base::operator_cast_to_double
                        (in_stack_fffffffffffffd20);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  local_1b0 = -*pdVar2;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)in_stack_fffffffffffffcf0,
             (Index)in_stack_fffffffffffffce8);
  Eigen::Matrix<double,1,2,1,1,2>::Matrix<double,double>
            ((Matrix<double,_1,_2,_1,_1,_2> *)in_stack_fffffffffffffd00,
             (double *)in_stack_fffffffffffffcf8,(double *)in_stack_fffffffffffffcf0);
  local_198 = Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
                         in_stack_fffffffffffffcf0,
                         (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                         in_stack_fffffffffffffce8);
  local_188 = Eigen::internal::dense_product_base::operator_cast_to_double
                        (in_stack_fffffffffffffd20);
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffd00,
             (double *)in_stack_fffffffffffffcf8,(double *)in_stack_fffffffffffffcf0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8,0x14a7bc);
  SVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8,0x14a7db);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8,0x14a7fb);
  this_02 = (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)*pSVar3;
  __x = (int)local_f8;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8,0x14a81b);
  local_1d0 = SVar4 * dVar1 + -((double)this_02 * *pSVar3);
  std::abs(__x);
  if (1e-05 <= extraout_XMM0_Qa) {
    local_200 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::inverse
                          ((MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)
                           in_stack_fffffffffffffce8);
    local_1f8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,2,2,0,2,2>>>::operator*
                          (in_stack_fffffffffffffcf0,
                           (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                           in_stack_fffffffffffffce8);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,2,2,0,2,2>>,Eigen::Matrix<double,2,1,0,2,1>,0>>
              ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffcf0,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
                *)in_stack_fffffffffffffce8);
    this = local_230;
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-(this_02,in_stack_fffffffffffffd10)
    ;
    this_00 = local_218;
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ((Matrix<double,_2,_1,_0,_2,_1> *)this,in_stack_fffffffffffffce8);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
                       (this,(Index)in_stack_fffffffffffffce8);
    this_01 = (CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator()
                       (this,(Index)in_stack_fffffffffffffce8);
    atan2((double)this_01,*pdVar2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x14a988);
    Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::operator<<
              (this_00,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)this);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (this_01,(Scalar *)this_00);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x14a9c5);
  }
  else {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcf0,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffce8);
  }
  return in_RDI;
}

Assistant:

Eigen::Vector3d Object::getIntersection(
    const Eigen::Vector2d& vec,
    const Eigen::Vector3d& _p1,
    const Eigen::Vector3d& _p2, 
    const Eigen::Vector2d& obs
) {
    const Eigen::Vector2d p1 = _p1.block<2, 1>(0, 0), p2 = _p2.block<2, 1>(0, 0);
    const Eigen::Vector2d vec_line = p2 - p1;
    Eigen::Matrix2d A = Eigen::Matrix2d::Zero();
    A << -vec(1), vec(0), -vec_line(1), vec_line(0);
    double b1 = Eigen::RowVector2d(-vec(1), vec(0)) * obs;
    double b2 = Eigen::RowVector2d(-vec_line(1), vec_line(0)) * p1;
    const Eigen::Vector2d b(b1, b2);
    double det = A(0, 0) * A(1, 1) - A(0, 1) * A(1, 0);
    if (std::abs(det) < 1e-5)
        return _p1;
    const Eigen::Vector2d pt = A.inverse() * b, new_vec = pt - obs;
    double angle = atan2(new_vec(1), new_vec(0));
    Eigen::Vector3d result;
    result << pt, angle;
    return result;                   // 解交点
}